

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O0

lws_spa * lws_spa_create_via_info(lws *wsi,lws_spa_create_info_t *i)

{
  char *pcVar1;
  char **ppcVar2;
  lws_urldecode_stateful *plVar3;
  int *piVar4;
  lws_spa *local_28;
  lws_spa *spa;
  lws_spa_create_info_t *i_local;
  lws *wsi_local;
  
  if (i->ac == (lwsac **)0x0) {
    local_28 = (lws_spa *)lws_zalloc(0x68,"spa");
  }
  else {
    local_28 = (lws_spa *)lwsac_use_zero(i->ac,0x68,i->ac_chunk_size);
  }
  if (local_28 == (lws_spa *)0x0) {
    return (lws_spa *)0x0;
  }
  memcpy(&local_28->i,i,0x38);
  if ((local_28->i).max_storage == 0) {
    (local_28->i).max_storage = 0x200;
  }
  if (i->ac == (lwsac **)0x0) {
    pcVar1 = (char *)lws_realloc((void *)0x0,(long)(local_28->i).max_storage,"spa");
    local_28->storage = pcVar1;
  }
  else {
    pcVar1 = (char *)lwsac_use(i->ac,(long)(local_28->i).max_storage,i->ac_chunk_size);
    local_28->storage = pcVar1;
  }
  if (local_28->storage == (char *)0x0) goto LAB_001570e4;
  local_28->end = local_28->storage + (long)i->max_storage + -1;
  if (i->count_params == 0) {
LAB_00156fae:
    plVar3 = lws_urldecode_s_create
                       (local_28,wsi,local_28->storage,i->max_storage,lws_urldecode_spa_cb);
    local_28->s = plVar3;
    if (local_28->s != (lws_urldecode_stateful *)0x0) {
      if (i->count_params == 0) {
LAB_0015705f:
        _lws_log(4,"%s: Created SPA %p\n","lws_spa_create_via_info",local_28);
        return local_28;
      }
      if (i->ac == (lwsac **)0x0) {
        piVar4 = (int *)lws_zalloc((long)i->count_params << 2,"spa param len");
        local_28->param_length = piVar4;
      }
      else {
        piVar4 = (int *)lwsac_use_zero(i->ac,(long)i->count_params << 2,i->ac_chunk_size);
        local_28->param_length = piVar4;
      }
      if (local_28->param_length != (int *)0x0) goto LAB_0015705f;
      lws_urldecode_s_destroy(local_28,local_28->s);
    }
    if (i->ac == (lwsac **)0x0) {
      lws_realloc(local_28->params,0,"lws_free");
    }
  }
  else {
    if (i->ac == (lwsac **)0x0) {
      ppcVar2 = (char **)lws_zalloc((long)i->count_params << 3,"spa params");
      local_28->params = ppcVar2;
    }
    else {
      ppcVar2 = (char **)lwsac_use_zero(i->ac,(long)i->count_params << 3,i->ac_chunk_size);
      local_28->params = ppcVar2;
    }
    if (local_28->params != (char **)0x0) goto LAB_00156fae;
  }
  if (i->ac == (lwsac **)0x0) {
    lws_realloc(local_28->storage,0,"lws_free");
  }
LAB_001570e4:
  if (i->ac == (lwsac **)0x0) {
    lws_realloc(local_28,0,"lws_free");
  }
  if (i->ac != (lwsac **)0x0) {
    lwsac_free(i->ac);
  }
  return (lws_spa *)0x0;
}

Assistant:

struct lws_spa *
lws_spa_create_via_info(struct lws *wsi, const lws_spa_create_info_t *i)
{
	struct lws_spa *spa;

	if (i->ac)
		spa = lwsac_use_zero(i->ac, sizeof(*spa), i->ac_chunk_size);
	else
		spa = lws_zalloc(sizeof(*spa), "spa");

	if (!spa)
		return NULL;

	spa->i = *i;
	if (!spa->i.max_storage)
		spa->i.max_storage = 512;

	if (i->ac)
		spa->storage = lwsac_use(i->ac, spa->i.max_storage,
					 i->ac_chunk_size);
	else
		spa->storage = lws_malloc(spa->i.max_storage, "spa");

	if (!spa->storage)
		goto bail2;

	spa->end = spa->storage + i->max_storage - 1;

	if (i->count_params) {
		if (i->ac)
			spa->params = lwsac_use_zero(i->ac,
				sizeof(char *) * i->count_params, i->ac_chunk_size);
		else
			spa->params = lws_zalloc(sizeof(char *) * i->count_params,
					 "spa params");
		if (!spa->params)
			goto bail3;
	}

	spa->s = lws_urldecode_s_create(spa, wsi, spa->storage, i->max_storage,
					lws_urldecode_spa_cb);
	if (!spa->s)
		goto bail4;

	if (i->count_params) {
		if (i->ac)
			spa->param_length = lwsac_use_zero(i->ac,
				sizeof(int) * i->count_params, i->ac_chunk_size);
		else
			spa->param_length = lws_zalloc(sizeof(int) * i->count_params,
						"spa param len");
		if (!spa->param_length)
			goto bail5;
	}

	lwsl_notice("%s: Created SPA %p\n", __func__, spa);

	return spa;

bail5:
	lws_urldecode_s_destroy(spa, spa->s);
bail4:
	if (!i->ac)
		lws_free(spa->params);
bail3:
	if (!i->ac)
		lws_free(spa->storage);
bail2:
	if (!i->ac)
		lws_free(spa);

	if (i->ac)
		lwsac_free(i->ac);

	return NULL;
}